

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BooleanDatatypeValidator.cpp
# Opt level: O1

void __thiscall
xercesc_4_0::BooleanDatatypeValidator::BooleanDatatypeValidator
          (BooleanDatatypeValidator *this,DatatypeValidator *baseValidator,
          RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *facets,
          RefArrayVectorOf<char16_t> *enums,int finalSet,MemoryManager *manager)

{
  int *piVar1;
  short *psVar2;
  XMLCh XVar3;
  XMLCh XVar4;
  MemoryManager *pMVar5;
  XMLCh *__src;
  XMLSize_t XVar6;
  RefHashTableBucketElem<xercesc_4_0::KVStringPair> *pRVar7;
  int iVar8;
  KVStringPair *toCopy;
  XMLCh *pXVar9;
  undefined4 extraout_var;
  RegularExpression *pRVar10;
  InvalidDatatypeFacetException *pIVar11;
  XMLCh *pXVar12;
  XMLSize_t XVar13;
  size_t __n;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> e;
  KVStringPair pair;
  RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> local_98;
  MemoryManager *local_68;
  KVStringPair local_60;
  
  DatatypeValidator::DatatypeValidator
            (&this->super_DatatypeValidator,baseValidator,facets,finalSet,Boolean,manager);
  (this->super_DatatypeValidator).super_XSerializable._vptr_XSerializable =
       (_func_int **)&PTR__DatatypeValidator_00419650;
  if (facets != (RefHashTableOf<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher> *)0x0) {
    if (enums != (RefArrayVectorOf<char16_t> *)0x0) {
      (*(enums->super_BaseRefVectorOf<char16_t>)._vptr_BaseRefVectorOf[1])(enums);
      pIVar11 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
      InvalidDatatypeFacetException::InvalidDatatypeFacetException
                (pIVar11,
                 "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                 ,0x36,FACET_Invalid_Tag,"enumeration",(char *)0x0,(char *)0x0,(char *)0x0,manager);
      __cxa_throw(pIVar11,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
    }
    local_98.super_XMLEnumerator<xercesc_4_0::KVStringPair>._vptr_XMLEnumerator =
         (_func_int **)&PTR__RefHashTableOfEnumerator_00412f20;
    local_98.fAdopted = false;
    local_98.fCurElem = (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0;
    local_98.fCurHash = 0;
    pRVar7 = local_98.fCurElem;
    if (facets->fHashModulus != 0) {
      XVar6 = 1;
      do {
        XVar13 = XVar6;
        pRVar7 = facets->fBucketList[XVar13 - 1];
        if (facets->fBucketList[XVar13 - 1] !=
            (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0) break;
        XVar6 = XVar13 + 1;
        pRVar7 = local_98.fCurElem;
        local_98.fCurHash = XVar13;
      } while (XVar13 != facets->fHashModulus);
    }
    local_98.fCurElem = pRVar7;
    local_98.fToEnum = facets;
    local_98.fMemoryManager = manager;
    local_68 = manager;
    while ((local_98.fCurElem != (RefHashTableBucketElem<xercesc_4_0::KVStringPair> *)0x0 ||
           (local_98.fCurHash != (local_98.fToEnum)->fHashModulus))) {
      toCopy = RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
               nextElement(&local_98);
      KVStringPair::KVStringPair(&local_60,toCopy);
      __src = local_60.fValue;
      if (local_60.fKey != L"pattern") {
        pXVar9 = L"pattern";
        if (local_60.fKey != (XMLCh *)0x0) {
          pXVar9 = L"pattern";
          pXVar12 = local_60.fKey;
          while (XVar3 = *pXVar12, XVar3 != L'\0') {
            pXVar12 = pXVar12 + 1;
            XVar4 = *pXVar9;
            pXVar9 = pXVar9 + 1;
            if (XVar3 != XVar4) goto LAB_002fb486;
          }
        }
        if (*pXVar9 != L'\0') {
LAB_002fb486:
          pIVar11 = (InvalidDatatypeFacetException *)__cxa_allocate_exception(0x30);
          InvalidDatatypeFacetException::InvalidDatatypeFacetException
                    (pIVar11,
                     "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/validators/datatype/BooleanDatatypeValidator.cpp"
                     ,0x4d,FACET_Invalid_Tag,local_60.fKey,(XMLCh *)0x0,(XMLCh *)0x0,(XMLCh *)0x0,
                     local_68);
          __cxa_throw(pIVar11,&InvalidDatatypeFacetException::typeinfo,XMLException::~XMLException);
        }
      }
      if ((this->super_DatatypeValidator).fPattern != (XMLCh *)0x0) {
        (*((this->super_DatatypeValidator).fMemoryManager)->_vptr_MemoryManager[4])();
        pRVar10 = (this->super_DatatypeValidator).fRegex;
        if (pRVar10 != (RegularExpression *)0x0) {
          (*pRVar10->_vptr_RegularExpression[1])();
        }
      }
      if (__src == (XMLCh *)0x0) {
        pXVar9 = (XMLCh *)0x0;
      }
      else {
        pMVar5 = (this->super_DatatypeValidator).fMemoryManager;
        __n = 0;
        do {
          psVar2 = (short *)((long)__src + __n);
          __n = __n + 2;
        } while (*psVar2 != 0);
        iVar8 = (*pMVar5->_vptr_MemoryManager[3])(pMVar5,__n);
        pXVar9 = (XMLCh *)CONCAT44(extraout_var,iVar8);
        memcpy(pXVar9,__src,__n);
      }
      (this->super_DatatypeValidator).fPattern = pXVar9;
      pRVar10 = (RegularExpression *)
                XMemory::operator_new(0x70,(this->super_DatatypeValidator).fMemoryManager);
      RegularExpression::RegularExpression
                (pRVar10,(this->super_DatatypeValidator).fPattern,L"X",
                 (this->super_DatatypeValidator).fMemoryManager);
      (this->super_DatatypeValidator).fRegex = pRVar10;
      piVar1 = &(this->super_DatatypeValidator).fFacetsDefined;
      *(byte *)piVar1 = (byte)*piVar1 | 8;
      KVStringPair::~KVStringPair(&local_60);
    }
    RefHashTableOfEnumerator<xercesc_4_0::KVStringPair,_xercesc_4_0::StringHasher>::
    ~RefHashTableOfEnumerator(&local_98);
  }
  return;
}

Assistant:

BooleanDatatypeValidator::BooleanDatatypeValidator(
                          DatatypeValidator*            const baseValidator
                        , RefHashTableOf<KVStringPair>* const facets
                        , RefArrayVectorOf<XMLCh>*      const enums
                        , const int                           finalSet
                        , MemoryManager* const                manager)
:DatatypeValidator(baseValidator, facets, finalSet, DatatypeValidator::Boolean, manager)
{

    // Set Facets if any defined
    if ( facets )
    {

        // Boolean shall NOT have enumeration
        if (enums) {
            delete enums;
            ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                    , XMLExcepts::FACET_Invalid_Tag
                    , "enumeration"
                    , manager);
        }

        XMLCh* key;
        XMLCh* value;
        RefHashTableOfEnumerator<KVStringPair> e(facets, false, manager);

        while (e.hasMoreElements())
        {
            KVStringPair pair = e.nextElement();
            key = pair.getKey();
            value = pair.getValue();

            if (XMLString::equals(key, SchemaSymbols::fgELT_PATTERN))
            {
                setPattern(value);
                setFacetsDefined(DatatypeValidator::FACET_PATTERN);
            }
            else
            {
                ThrowXMLwithMemMgr1(InvalidDatatypeFacetException
                        , XMLExcepts::FACET_Invalid_Tag
                        , key
                        , manager);
            }

        }

    }// End of facet setting
}